

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::Calc_Sxi_xi_compact
          (ChElementHexaANCF_3843 *this,VectorN *Sxi_xi_compact,double xi,double eta,double zeta)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar23 [64];
  undefined8 in_XMM2_Qb;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  auVar23._8_56_ = in_register_00001248;
  auVar23._0_8_ = eta;
  auVar21._8_56_ = in_register_00001208;
  auVar21._0_8_ = xi;
  dVar2 = zeta + -1.0;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar2;
  auVar8 = vmulsd_avx512f(auVar24,ZEXT816(0x3fb0000000000000));
  dVar3 = eta + -1.0;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar3;
  auVar9 = vmulsd_avx512f(auVar27,auVar8);
  auVar22 = auVar23._0_16_;
  auVar11 = vfmadd213sd_fma(auVar22,auVar22,auVar22);
  auVar17 = ZEXT816(0x4008000000000000);
  auVar19 = auVar21._0_16_;
  auVar10 = vmulsd_avx512f(auVar19,auVar17);
  auVar11 = vfmadd231sd_avx512f(auVar11,auVar10,auVar19);
  auVar14._8_8_ = in_XMM2_Qb;
  auVar14._0_8_ = zeta;
  auVar15._8_8_ = in_XMM2_Qb;
  auVar15._0_8_ = zeta;
  auVar6 = vfmadd231sd_fma(auVar11,auVar14,auVar15);
  dVar4 = auVar6._0_8_ + zeta + -3.0;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0] = dVar4 * auVar9._0_8_;
  auVar31 = ZEXT816(0x3fa0000000000000);
  auVar12 = vfmadd213sd_avx512f(auVar17,auVar19,ZEXT816(0x3ff0000000000000));
  dVar32 = auVar12._0_8_;
  dVar5 = xi + -1.0;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[1] = dVar3 * dVar2 * dVar5 * dVar32 * this->m_lenX * 0.03125;
  auVar13 = vaddsd_avx512f(auVar22,ZEXT816(0x3ff0000000000000));
  dVar30 = auVar13._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[2] = this->m_lenY * 0.03125 * dVar30 * dVar3 * dVar3 * dVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = this->m_lenZ;
  auVar11 = vmulsd_avx512f(auVar31,auVar11);
  auVar16._8_8_ = in_XMM2_Qb;
  auVar16._0_8_ = zeta;
  auVar14 = vaddsd_avx512f(auVar16,ZEXT816(0x3ff0000000000000));
  auVar11 = vmulsd_avx512f(auVar14,auVar11);
  auVar11 = vmulsd_avx512f(auVar24,auVar11);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2;
  auVar11 = vmulsd_avx512f(auVar25,auVar11);
  auVar11 = vmulsd_avx512f(auVar27,auVar11);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 3;
  vmovsd_avx512f(auVar11);
  *pdVar1 = *pdVar1;
  auVar15 = vmulsd_avx512f(auVar25,ZEXT816(0xbfb0000000000000));
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar3;
  auVar11 = vmulsd_avx512f(auVar28,auVar15);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar4;
  auVar11 = vmulsd_avx512f(auVar11,auVar35);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[4] = auVar11._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this->m_lenX;
  auVar11 = vmulsd_avx512f(auVar31,auVar9);
  auVar16 = vaddsd_avx512f(auVar19,ZEXT816(0x3ff0000000000000));
  auVar9 = vmulsd_avx512f(auVar16,auVar11);
  auVar11 = vfmadd213sd_fma(auVar17,auVar19,ZEXT816(0xbff0000000000000));
  auVar9 = vmulsd_avx512f(auVar11,auVar9);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[5] = auVar9._0_8_ * dVar2 * dVar3;
  auVar24 = ZEXT816(0xbfa0000000000000);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = this->m_lenY;
  auVar9 = vmulsd_avx512f(auVar24,auVar17);
  auVar9 = vmulsd_avx512f(auVar13,auVar9);
  auVar9 = vmulsd_avx512f(auVar28,auVar9);
  auVar9 = vmulsd_avx512f(auVar28,auVar9);
  auVar9 = vmulsd_avx512f(auVar25,auVar9);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 6;
  vmovsd_avx512f(auVar9);
  *pdVar1 = *pdVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = this->m_lenZ;
  auVar9 = vmulsd_avx512f(auVar24,auVar18);
  auVar9 = vmulsd_avx512f(auVar14,auVar9);
  auVar9 = vmulsd_avx512f(auVar25,auVar9);
  auVar9 = vmulsd_avx512f(auVar25,auVar9);
  auVar9 = vmulsd_avx512f(auVar28,auVar9);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 7;
  vmovsd_avx512f(auVar9);
  *pdVar1 = *pdVar1;
  auVar17 = vmulsd_avx512f(auVar13,auVar8);
  auVar9 = vfmsub213sd_fma(auVar22,auVar22,auVar22);
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar10,auVar19);
  auVar22._8_8_ = in_XMM2_Qb;
  auVar22._0_8_ = zeta;
  auVar7._8_8_ = in_XMM2_Qb;
  auVar7._0_8_ = zeta;
  auVar9 = vfmadd231sd_fma(auVar9,auVar22,auVar7);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar9._0_8_ + zeta + -3.0;
  auVar17 = vmulsd_avx512f(auVar17,auVar20);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 8;
  vmovsd_avx512f(auVar17);
  *pdVar1 = *pdVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = this->m_lenX;
  auVar17 = vmulsd_avx512f(auVar24,auVar8);
  auVar17 = vmulsd_avx512f(auVar16,auVar17);
  auVar17 = vmulsd_avx512f(auVar11,auVar17);
  auVar17 = vmulsd_avx512f(auVar25,auVar17);
  auVar17 = vmulsd_avx512f(auVar13,auVar17);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 9;
  vmovsd_avx512f(auVar17);
  *pdVar1 = *pdVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = this->m_lenY;
  auVar17 = vmulsd_avx512f(auVar24,auVar10);
  auVar17 = vmulsd_avx512f(auVar28,auVar17);
  auVar17 = vmulsd_avx512f(auVar13,auVar17);
  auVar17 = vmulsd_avx512f(auVar13,auVar17);
  auVar17 = vmulsd_avx512f(auVar25,auVar17);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 10;
  vmovsd_avx512f(auVar17);
  *pdVar1 = *pdVar1;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = this->m_lenZ;
  auVar17 = vmulsd_avx512f(auVar31,auVar19);
  auVar17 = vmulsd_avx512f(auVar14,auVar17);
  auVar17 = vmulsd_avx512f(auVar25,auVar17);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar2;
  auVar17 = vmulsd_avx512f(auVar26,auVar17);
  auVar17 = vmulsd_avx512f(auVar13,auVar17);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 0xb;
  vmovsd_avx512f(auVar17);
  *pdVar1 = *pdVar1;
  auVar17 = vmulsd_avx512f(auVar13,auVar15);
  auVar17 = vmulsd_avx512f(auVar17,auVar20);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0xc] = auVar17._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0xd] = dVar30 * dVar2 * dVar5 * dVar32 * this->m_lenX * -0.03125;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0xe] = dVar2 * dVar30 * dVar30 * dVar3 * this->m_lenY * 0.03125;
  dVar34 = auVar14._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0xf] = dVar30 * dVar2 * dVar2 * dVar34 * this->m_lenZ * -0.03125;
  auVar17 = vmulsd_avx512f(auVar14,ZEXT816(0xbfb0000000000000));
  auVar18 = vmulsd_avx512f(auVar28,auVar17);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = (auVar6._0_8_ - zeta) + -3.0;
  auVar18 = vmulsd_avx512f(auVar18,auVar36);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 0x10;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = this->m_lenX;
  auVar18 = vmulsd_avx512f(auVar24,auVar6);
  auVar18 = vmulsd_avx512f(auVar12,auVar18);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar5;
  auVar18 = vmulsd_avx512f(auVar33,auVar18);
  auVar18 = vmulsd_avx512f(auVar14,auVar18);
  auVar18 = vmulsd_avx512f(auVar28,auVar18);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 0x11;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = this->m_lenY;
  auVar18 = vmulsd_avx512f(auVar24,auVar12);
  auVar18 = vmulsd_avx512f(auVar13,auVar18);
  auVar18 = vmulsd_avx512f(auVar28,auVar18);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar3;
  auVar18 = vmulsd_avx512f(auVar29,auVar18);
  auVar18 = vmulsd_avx512f(auVar14,auVar18);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 0x12;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = this->m_lenZ;
  auVar18 = vmulsd_avx512f(auVar31,auVar13);
  auVar18 = vmulsd_avx512f(auVar26,auVar18);
  auVar18 = vmulsd_avx512f(auVar14,auVar18);
  auVar18 = vmulsd_avx512f(auVar14,auVar18);
  auVar18 = vmulsd_avx512f(auVar29,auVar18);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 0x13;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar34 * 0.0625;
  auVar18 = vmulsd_avx512f(auVar29,auVar31);
  auVar18 = vmulsd_avx512f(auVar18,auVar36);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x14] = auVar18._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x15] = dVar34 * auVar11._0_8_ * auVar16._0_8_ * this->m_lenX * -0.03125 * dVar3;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x16] = dVar34 * this->m_lenY * 0.03125 * dVar30 * dVar3 * dVar3;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x17] = dVar34 * dVar34 * this->m_lenZ * -0.03125 * dVar2 * dVar3;
  dVar4 = (auVar9._0_8_ - zeta) + -3.0;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x18] = dVar30 * auVar17._0_8_ * dVar4;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x19] = dVar30 * dVar34 * auVar11._0_8_ * auVar16._0_8_ * this->m_lenX * 0.03125;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1a] = dVar34 * dVar30 * dVar30 * dVar3 * this->m_lenY * 0.03125;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1b] = dVar30 * dVar34 * dVar34 * dVar2 * this->m_lenZ * 0.03125;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1c] = dVar34 * 0.0625 * dVar30 * dVar4;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1d] = dVar30 * dVar34 * dVar5 * dVar32 * this->m_lenX * 0.03125;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1e] = dVar34 * dVar30 * dVar30 * dVar3 * this->m_lenY * -0.03125;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1f] = dVar30 * dVar34 * dVar34 * dVar2 * this->m_lenZ * -0.03125;
  return;
}

Assistant:

void ChElementHexaANCF_3843::Calc_Sxi_xi_compact(VectorN& Sxi_xi_compact, double xi, double eta, double zeta) {
    Sxi_xi_compact(0) = 0.0625 * (zeta - 1) * (eta - 1) * (eta * eta + eta + 3 * xi * xi + zeta * zeta + zeta - 3);
    Sxi_xi_compact(1) = 0.03125 * m_lenX * (3 * xi + 1) * (xi - 1) * (zeta - 1) * (eta - 1);
    Sxi_xi_compact(2) = 0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta - 1);
    Sxi_xi_compact(3) = 0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (eta - 1);
    Sxi_xi_compact(4) = -0.0625 * (zeta - 1) * (eta - 1) * (eta * eta + eta + 3 * xi * xi + zeta * zeta + zeta - 3);
    Sxi_xi_compact(5) = 0.03125 * m_lenX * (xi + 1) * (3 * xi - 1) * (zeta - 1) * (eta - 1);
    Sxi_xi_compact(6) = -0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta - 1);
    Sxi_xi_compact(7) = -0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (eta - 1);
    Sxi_xi_compact(8) = 0.0625 * (zeta - 1) * (eta + 1) * (eta * eta - eta + 3 * xi * xi + zeta * zeta + zeta - 3);
    Sxi_xi_compact(9) = -0.03125 * m_lenX * (xi + 1) * (3 * xi - 1) * (zeta - 1) * (eta + 1);
    Sxi_xi_compact(10) = -0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta - 1);
    Sxi_xi_compact(11) = 0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (eta + 1);
    Sxi_xi_compact(12) = -0.0625 * (zeta - 1) * (eta + 1) * (eta * eta - eta + 3 * xi * xi + zeta * zeta + zeta - 3);
    Sxi_xi_compact(13) = -0.03125 * m_lenX * (3 * xi + 1) * (xi - 1) * (zeta - 1) * (eta + 1);
    Sxi_xi_compact(14) = 0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta - 1);
    Sxi_xi_compact(15) = -0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (eta + 1);
    Sxi_xi_compact(16) = -0.0625 * (zeta + 1) * (eta - 1) * (eta * eta + eta + 3 * xi * xi + zeta * zeta - zeta - 3);
    Sxi_xi_compact(17) = -0.03125 * m_lenX * (3 * xi + 1) * (xi - 1) * (zeta + 1) * (eta - 1);
    Sxi_xi_compact(18) = -0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta + 1);
    Sxi_xi_compact(19) = 0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (eta - 1);
    Sxi_xi_compact(20) = 0.0625 * (zeta + 1) * (eta - 1) * (eta * eta + eta + 3 * xi * xi + zeta * zeta - zeta - 3);
    Sxi_xi_compact(21) = -0.03125 * m_lenX * (xi + 1) * (3 * xi - 1) * (zeta + 1) * (eta - 1);
    Sxi_xi_compact(22) = 0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta + 1);
    Sxi_xi_compact(23) = -0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (eta - 1);
    Sxi_xi_compact(24) = -0.0625 * (zeta + 1) * (eta + 1) * (eta * eta - eta + 3 * xi * xi + zeta * zeta - zeta - 3);
    Sxi_xi_compact(25) = 0.03125 * m_lenX * (xi + 1) * (3 * xi - 1) * (zeta + 1) * (eta + 1);
    Sxi_xi_compact(26) = 0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta + 1);
    Sxi_xi_compact(27) = 0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (eta + 1);
    Sxi_xi_compact(28) = 0.0625 * (zeta + 1) * (eta + 1) * (eta * eta - eta + 3 * xi * xi + zeta * zeta - zeta - 3);
    Sxi_xi_compact(29) = 0.03125 * m_lenX * (3 * xi + 1) * (xi - 1) * (zeta + 1) * (eta + 1);
    Sxi_xi_compact(30) = -0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta + 1);
    Sxi_xi_compact(31) = -0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (eta + 1);
}